

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::MapKeyDataOnlyByteSize(FieldDescriptor *field,MapKey *value)

{
  Type TVar1;
  uint32_t value_00;
  int32_t iVar2;
  CppType *v1;
  CppType *v2;
  char *failure_msg;
  LogMessage *pLVar3;
  uint64_t value_01;
  int64_t iVar4;
  string_view value_02;
  LogMessage local_90;
  Voidify local_79;
  string_view local_78;
  LogMessage local_68;
  Voidify local_55 [13];
  LogMessage local_48;
  Voidify local_31;
  CppType local_30;
  CppType local_2c;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  MapKey *value_local;
  FieldDescriptor *field_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)value;
  value_local = (MapKey *)field;
  TVar1 = FieldDescriptor::type(field);
  local_2c = FieldDescriptor::TypeToCppType(TVar1);
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::CppType>(&local_2c);
  local_30 = MapKey::type((MapKey *)absl_log_internal_check_op_result);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::CppType>(&local_30);
  local_28 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::CppType,google::protobuf::internal::FieldDescriptorLite::CppType>
                       (v1,v2,"FieldDescriptor::TypeToCppType(field->type()) == value.type()");
  if (local_28 == (Nullable<const_char_*>)0x0) {
    TVar1 = FieldDescriptor::type((FieldDescriptor *)value_local);
    switch(TVar1) {
    case TYPE_DOUBLE:
    case TYPE_FLOAT:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
    case TYPE_ENUM:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
                 ,0x607);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar3,(char (*) [12])"Unsupported");
      absl::lts_20250127::log_internal::Voidify::operator&&(local_55,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_68);
    case TYPE_INT64:
      iVar4 = MapKey::GetInt64Value((MapKey *)absl_log_internal_check_op_result);
      field_local = (FieldDescriptor *)WireFormatLite::Int64Size(iVar4);
      break;
    case TYPE_UINT64:
      value_01 = MapKey::GetUInt64Value((MapKey *)absl_log_internal_check_op_result);
      field_local = (FieldDescriptor *)WireFormatLite::UInt64Size(value_01);
      break;
    case TYPE_INT32:
      iVar2 = MapKey::GetInt32Value((MapKey *)absl_log_internal_check_op_result);
      field_local = (FieldDescriptor *)WireFormatLite::Int32Size(iVar2);
      break;
    case TYPE_FIXED64:
      field_local = (FieldDescriptor *)0x8;
      break;
    case TYPE_FIXED32:
      field_local = (FieldDescriptor *)0x4;
      break;
    case TYPE_BOOL:
      field_local = (FieldDescriptor *)0x1;
      break;
    case TYPE_STRING:
      local_78 = MapKey::GetStringValue((MapKey *)absl_log_internal_check_op_result);
      value_02._M_str = local_78._M_str;
      value_02._M_len = (size_t)value_02._M_str;
      field_local = (FieldDescriptor *)
                    WireFormatLite::StringSize((WireFormatLite *)local_78._M_len,value_02);
      break;
    case TYPE_UINT32:
      value_00 = MapKey::GetUInt32Value((MapKey *)absl_log_internal_check_op_result);
      field_local = (FieldDescriptor *)WireFormatLite::UInt32Size(value_00);
      break;
    case TYPE_SFIXED32:
      field_local = (FieldDescriptor *)0x4;
      break;
    case TYPE_SFIXED64:
      field_local = (FieldDescriptor *)0x8;
      break;
    case TYPE_SINT32:
      iVar2 = MapKey::GetInt32Value((MapKey *)absl_log_internal_check_op_result);
      field_local = (FieldDescriptor *)WireFormatLite::SInt32Size(iVar2);
      break;
    case MAX_TYPE:
      iVar4 = MapKey::GetInt64Value((MapKey *)absl_log_internal_check_op_result);
      field_local = (FieldDescriptor *)WireFormatLite::SInt64Size(iVar4);
      break;
    default:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
                 ,0x622);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar3,(char (*) [16])"Cannot get here");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_90);
    }
    return (size_t)field_local;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
             ,0x5ff,failure_msg);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_48);
}

Assistant:

size_t MapKeyDataOnlyByteSize(const FieldDescriptor* field,
                              const MapKey& value) {
  ABSL_DCHECK_EQ(FieldDescriptor::TypeToCppType(field->type()), value.type());
  switch (field->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_BYTES:
    case FieldDescriptor::TYPE_ENUM:
      ABSL_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  ABSL_LOG(FATAL) << "Cannot get here";
  return 0;
}